

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  int iVar6;
  short sVar7;
  long lVar8;
  long lVar9;
  JSAMPLE JVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  JSAMPLE *pJVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  int aiStack_154 [7];
  int aiStack_138 [66];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  uVar19 = 9;
  lVar26 = 0;
  do {
    sVar1 = *(short *)((long)coef_block + lVar26 + 0x10);
    sVar7 = *(short *)((long)coef_block + lVar26 + 0x20);
    if (sVar7 == 0 && sVar1 == 0) {
      if ((((*(short *)((long)coef_block + lVar26 + 0x30) != 0) ||
           (*(short *)((long)coef_block + lVar26 + 0x40) != 0)) ||
          (*(short *)((long)coef_block + lVar26 + 0x50) != 0)) ||
         ((*(short *)((long)coef_block + lVar26 + 0x60) != 0 ||
          (*(short *)((long)coef_block + lVar26 + 0x70) != 0)))) {
        sVar7 = 0;
        goto LAB_0010ab50;
      }
      iVar6 = (int)*(short *)((long)coef_block + lVar26) * *(int *)((long)pvVar5 + lVar26 * 2) * 4;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x1c) = iVar6;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x3c) = iVar6;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x5c) = iVar6;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x7c) = iVar6;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x9c) = iVar6;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0xbc) = iVar6;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0xdc) = iVar6;
      lVar8 = 0xe0;
    }
    else {
LAB_0010ab50:
      lVar8 = (long)sVar7 * (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0x40);
      lVar14 = (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0xc0) *
               (long)*(short *)((long)coef_block + lVar26 + 0x60);
      lVar28 = (lVar14 + lVar8) * 0x1151;
      lVar9 = lVar8 * 0x187e + lVar28;
      lVar28 = lVar14 * -0x3b21 + lVar28;
      lVar8 = (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0x80) *
              (long)*(short *)((long)coef_block + lVar26 + 0x40);
      uVar15 = (long)*(int *)((long)pvVar5 + lVar26 * 2) *
               (long)*(short *)((long)coef_block + lVar26) * 0x2000;
      lVar29 = lVar8 * 0x2000 + uVar15 + 0x400;
      lVar16 = (uVar15 | 0x400) + lVar8 * -0x2000;
      lVar8 = lVar29 + lVar9;
      lVar29 = lVar29 - lVar9;
      lVar9 = lVar16 + lVar28;
      lVar16 = lVar16 - lVar28;
      lVar31 = (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0xe0) *
               (long)*(short *)((long)coef_block + lVar26 + 0x70);
      lVar30 = (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0xa0) *
               (long)*(short *)((long)coef_block + lVar26 + 0x50);
      lVar28 = (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0x60) *
               (long)*(short *)((long)coef_block + lVar26 + 0x30);
      lVar18 = (long)*(int *)((long)pvVar5 + lVar26 * 2 + 0x20) * (long)sVar1;
      lVar14 = (lVar30 + lVar18 + lVar28 + lVar31) * 0x25a1;
      lVar22 = (lVar28 + lVar31) * -0x3ec5 + lVar14;
      lVar14 = (lVar30 + lVar18) * -0xc7c + lVar14;
      lVar21 = (lVar18 + lVar31) * -0x1ccd;
      lVar31 = lVar31 * 0x98e + lVar21 + lVar22;
      lVar21 = lVar18 * 0x300b + lVar21 + lVar14;
      lVar18 = (lVar28 + lVar30) * -0x5203;
      lVar14 = lVar30 * 0x41b3 + lVar18 + lVar14;
      lVar22 = lVar28 * 0x6254 + lVar18 + lVar22;
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x1c) = (int)((ulong)(lVar8 + lVar21) >> 0xb);
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0xfc) = (int)((ulong)(lVar8 - lVar21) >> 0xb);
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x3c) = (int)((ulong)(lVar22 + lVar9) >> 0xb);
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0xdc) = (int)((ulong)(lVar9 - lVar22) >> 0xb);
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x5c) = (int)((ulong)(lVar14 + lVar16) >> 0xb);
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0xbc) = (int)((ulong)(lVar16 - lVar14) >> 0xb);
      *(int *)((long)aiStack_154 + lVar26 * 2 + 0x7c) = (int)((ulong)(lVar31 + lVar29) >> 0xb);
      iVar6 = (int)((ulong)(lVar29 - lVar31) >> 0xb);
      lVar8 = 0x80;
    }
    *(int *)((long)aiStack_154 + lVar26 * 2 + lVar8 + 0x1c) = iVar6;
    uVar19 = uVar19 - 1;
    lVar26 = lVar26 + 2;
  } while (1 < uVar19);
  lVar26 = 7;
  do {
    pJVar23 = (JSAMPLE *)(*(long *)((long)output_buf + lVar26 + -7) + (ulong)output_col);
    iVar6 = aiStack_154[lVar26 + 1];
    iVar24 = aiStack_154[lVar26 + 2];
    if (aiStack_154[lVar26 + 2] == 0 && iVar6 == 0) {
      iVar13 = 0;
      iVar24 = 0;
      if (((aiStack_154[lVar26 + 3] != 0) || (aiStack_154[lVar26 + 4] != 0)) ||
         ((iVar24 = iVar13, aiStack_154[lVar26 + 5] != 0 ||
          ((aiStack_154[lVar26 + 6] != 0 || (aiStack_154[lVar26 + 7] != 0)))))) goto LAB_0010ada4;
      JVar10 = pJVar4[(ulong)(aiStack_154[lVar26] + 0x10U >> 5 & 0x3ff) + 0x80];
      auVar32 = pshuflw(ZEXT216(CONCAT11(JVar10,JVar10)),ZEXT216(CONCAT11(JVar10,JVar10)),0);
      *(int *)pJVar23 = auVar32._0_4_;
      pJVar23[4] = JVar10;
      pJVar23[5] = JVar10;
      pJVar23[6] = JVar10;
      lVar8 = 7;
    }
    else {
LAB_0010ada4:
      iVar11 = (aiStack_154[lVar26 + 6] + iVar24) * 0x1151;
      iVar13 = iVar24 * 0x187e + iVar11;
      iVar11 = aiStack_154[lVar26 + 6] * -0x3b21 + iVar11;
      iVar2 = aiStack_154[lVar26 + 3];
      iVar25 = (aiStack_154[lVar26] + aiStack_154[lVar26 + 4] + 0x10) * 0x2000;
      iVar27 = ((aiStack_154[lVar26] + 0x10) - aiStack_154[lVar26 + 4]) * 0x2000;
      iVar24 = iVar25 + iVar13;
      iVar25 = iVar25 - iVar13;
      iVar13 = iVar27 + iVar11;
      iVar27 = iVar27 - iVar11;
      iVar11 = aiStack_154[lVar26 + 7];
      iVar3 = aiStack_154[lVar26 + 5];
      iVar17 = (iVar2 + iVar11 + iVar6 + iVar3) * 0x25a1;
      iVar12 = (iVar2 + iVar11) * -0x3ec5 + iVar17;
      iVar17 = (iVar6 + iVar3) * -0xc7c + iVar17;
      iVar20 = (iVar11 + iVar6) * -0x1ccd;
      iVar11 = iVar11 * 0x98e + iVar20 + iVar12;
      iVar20 = iVar6 * 0x300b + iVar20 + iVar17;
      iVar6 = (iVar2 + iVar3) * -0x5203;
      iVar17 = iVar3 * 0x41b3 + iVar6 + iVar17;
      iVar12 = iVar2 * 0x6254 + iVar6 + iVar12;
      *pJVar23 = pJVar4[(ulong)((uint)(iVar24 + iVar20) >> 0x12 & 0x3ff) + 0x80];
      pJVar23[7] = pJVar4[(ulong)((uint)(iVar24 - iVar20) >> 0x12 & 0x3ff) + 0x80];
      pJVar23[1] = pJVar4[(ulong)((uint)(iVar12 + iVar13) >> 0x12 & 0x3ff) + 0x80];
      pJVar23[6] = pJVar4[(ulong)((uint)(iVar13 - iVar12) >> 0x12 & 0x3ff) + 0x80];
      pJVar23[2] = pJVar4[(ulong)((uint)(iVar17 + iVar27) >> 0x12 & 0x3ff) + 0x80];
      pJVar23[5] = pJVar4[(ulong)((uint)(iVar27 - iVar17) >> 0x12 & 0x3ff) + 0x80];
      pJVar23[3] = pJVar4[(ulong)((uint)(iVar11 + iVar25) >> 0x12 & 0x3ff) + 0x80];
      JVar10 = pJVar4[(ulong)((uint)(iVar25 - iVar11) >> 0x12 & 0x3ff) + 0x80];
      lVar8 = 4;
    }
    pJVar23[lVar8] = JVar10;
    lVar26 = lVar26 + 8;
    if (lVar26 == 0x47) {
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_islow (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;

      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;

    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int) DESCALE((INT32) wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    /* Add fudge factor here for final descale. */
    z2 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z3 = (INT32) wsptr[4];

    tmp0 = (z2 + z3) << CONST_BITS;
    tmp1 = (z2 - z3) << CONST_BITS;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (INT32) wsptr[7];
    tmp1 = (INT32) wsptr[5];
    tmp2 = (INT32) wsptr[3];
    tmp3 = (INT32) wsptr[1];

    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp13 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp13 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}